

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O3

REF_STATUS ref_search_home(REF_SEARCH ref_search,REF_INT child,REF_INT parent)

{
  int *piVar1;
  int iVar2;
  REF_STATUS RVar3;
  REF_INT *pRVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (child == -1) {
    pcVar8 = "empty child";
    uVar5 = 0x51;
  }
  else {
    if (parent != -1) {
      if (child == parent) {
        return 0;
      }
      iVar2 = ref_search->d;
      dVar9 = 0.0;
      if (0 < (long)iVar2) {
        lVar6 = 0;
        do {
          dVar10 = ref_search->pos[iVar2 * parent + lVar6] - ref_search->pos[iVar2 * child + lVar6];
          dVar9 = dVar9 + dVar10 * dVar10;
          lVar6 = lVar6 + 1;
        } while (iVar2 != lVar6);
      }
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar10 = ref_search->children_ball[parent];
      dVar9 = dVar9 + ref_search->radius[child];
      if (dVar10 <= dVar9) {
        dVar10 = dVar9;
      }
      ref_search->children_ball[parent] = dVar10;
      pRVar4 = ref_search->left;
      piVar1 = pRVar4 + parent;
      if ((*piVar1 != -1) && (pRVar4 = ref_search->right, pRVar4[parent] != -1)) {
        iVar2 = ref_search->d;
        dVar9 = 0.0;
        if (0 < (long)iVar2) {
          lVar6 = 0;
          do {
            dVar10 = ref_search->pos[*piVar1 * iVar2 + lVar6] -
                     ref_search->pos[iVar2 * child + lVar6];
            dVar9 = dVar9 + dVar10 * dVar10;
            lVar6 = lVar6 + 1;
          } while (iVar2 != lVar6);
        }
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        lVar6 = (long)ref_search->d;
        dVar10 = 0.0;
        if (0 < lVar6) {
          lVar7 = 0;
          do {
            dVar11 = ref_search->pos[ref_search->right[parent] * lVar6 + lVar7] -
                     ref_search->pos[ref_search->d * child + lVar7];
            dVar10 = dVar10 + dVar11 * dVar11;
            lVar7 = lVar7 + 1;
          } while (lVar6 != lVar7);
        }
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        if (dVar10 <= dVar9) {
          RVar3 = ref_search_home(ref_search,child,ref_search->right[parent]);
          if (RVar3 == 0) {
            return 0;
          }
          pcVar8 = "recursively add to right child";
          uVar5 = 0x72;
        }
        else {
          RVar3 = ref_search_home(ref_search,child,ref_search->left[parent]);
          if (RVar3 == 0) {
            return 0;
          }
          pcVar8 = "recursively add to left child";
          uVar5 = 0x6f;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               uVar5,"ref_search_home",1,pcVar8);
        return 1;
      }
      pRVar4[parent] = child;
      return 0;
    }
    pcVar8 = "empty parent";
    uVar5 = 0x52;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",uVar5,
         "ref_search_home",pcVar8);
  return 1;
}

Assistant:

REF_FCN static REF_STATUS ref_search_home(REF_SEARCH ref_search, REF_INT child,
                                          REF_INT parent) {
  REF_DBL child_distance;
  REF_DBL left_distance, right_distance;

  RUS(REF_EMPTY, child, "empty child");
  RUS(REF_EMPTY, parent, "empty parent");

  /* done, don't add self to children */
  if (child == parent) return REF_SUCCESS;

  RSS(ref_search_distance(ref_search, child, parent, &child_distance), "d");
  ref_search->children_ball[parent] =
      MAX(ref_search->children_ball[parent],
          child_distance + ref_search->radius[child]);

  if (REF_EMPTY == ref_search->left[parent]) {
    ref_search->left[parent] = child;
    return REF_SUCCESS;
  }

  if (REF_EMPTY == ref_search->right[parent]) {
    ref_search->right[parent] = child;
    return REF_SUCCESS;
  }

  RSS(ref_search_distance(ref_search, child, ref_search->left[parent],
                          &left_distance),
      "left dist");
  RSS(ref_search_distance(ref_search, child, ref_search->right[parent],
                          &right_distance),
      "right dist");

  if (left_distance < right_distance) {
    RSS(ref_search_home(ref_search, child, ref_search->left[parent]),
        "recursively add to left child");
  } else {
    RSS(ref_search_home(ref_search, child, ref_search->right[parent]),
        "recursively add to right child");
  }

  return REF_SUCCESS;
}